

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

char * CVmObjString::cvt_int_to_str(char *buf,size_t buflen,int32_t inval,int radix,int flags)

{
  bool bVar1;
  char cVar2;
  char *pcVar3;
  uint in_ECX;
  uint in_EDX;
  long in_RSI;
  char *in_RDI;
  uint in_R8D;
  char c;
  size_t len;
  char *p;
  uint32_t val;
  int neg;
  size_t in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  char *local_30;
  uint local_24;
  
  pcVar3 = in_RDI + in_RSI;
  if (((int)in_EDX < 0) && ((in_R8D & 1) == 0)) {
    bVar1 = true;
    local_24 = -in_EDX;
  }
  else {
    bVar1 = false;
    local_24 = in_EDX;
  }
  do {
    local_30 = pcVar3;
    if (local_30 == in_RDI) {
      err_throw(0);
    }
    pcVar3 = local_30 + -1;
    cVar2 = (char)(local_24 % in_ECX);
    if (cVar2 < '\n') {
      cVar2 = cVar2 + '0';
    }
    else {
      cVar2 = cVar2 + '7';
    }
    *pcVar3 = cVar2;
    local_24 = local_24 / in_ECX;
  } while (local_24 != 0);
  if (bVar1) {
    if (pcVar3 == in_RDI) {
      err_throw(0);
    }
    local_30[-2] = '-';
    pcVar3 = local_30 + -2;
  }
  local_30 = pcVar3;
  if (in_RDI + 2 <= local_30) {
    vmb_put_len((char *)CONCAT17(cVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
    return local_30 + -2;
  }
  err_throw(0);
}

Assistant:

char *CVmObjString::cvt_int_to_str(char *buf, size_t buflen,
                                   int32_t inval, int radix, int flags)
{
    int neg;
    uint32_t val;
    char *p;
    size_t len;

    /* start at the end of the buffer */
    p = buf + buflen;

    /* 
     *   if it's negative, and we're converting to a signed representation,
     *   use a leading minus sign plus the absolute value; otherwise, treat
     *   the value as unsigned 
     */
    if (inval >= 0 || (flags & TOSTR_UNSIGNED) != 0)
    {
        /* 
         *   the value is non-negative, either because the signed
         *   interpretation is non-negative or because we're using an
         *   unsigned interpretation (in which case there's no such thing as
         *   negative) 
         */
        neg = FALSE;

        /* use the value as-is */
        val = (uint32_t)inval;
    }
    else
    {   
        /* it's signed and negative - note that we need a minus sign */
        neg = TRUE;

        /* use the positive value for the conversion */
        val = (uint32_t)(-inval);
    }

    /* store numerals in reverse order */
    do
    {
        char c;

        /* if we have no more room, throw an error */
        if (p == buf)
            err_throw(VMERR_CONV_BUF_OVF);
        
        /* move on to the next available character in the buffer */
        --p;

        /* figure the character representation of this numeral */
        c = (char)(val % radix);
        if (c < 10)
            c += '0';
        else
            c += 'A' - 10;

        /* store the numeral at the current location */
        *p = c;

        /* divide the remaining number by the radix */
        val /= radix;
    } while (val != 0);

    /* store the leading minus sign if necessary */
    if (neg)
    {
        /* if we don't have room, throw an error */
        if (p == buf)
            err_throw(VMERR_CONV_BUF_OVF);

        /* move to the next byte */
        --p;

        /* store the minus sign */
        *p = '-';
    }

    /* calculate the length */
    len = buflen - (p - buf);

    /* make sure we have room for the length prefix */
    if (p < buf + 2)
        err_throw(VMERR_CONV_BUF_OVF);

    /* store the length prefix */
    p -= 2;
    vmb_put_len(p, len);

    /* return the pointer to the start of the number */
    return p;
}